

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAppender.h
# Opt level: O2

void aeron::concurrent::logbuffer::TermAppender::checkTerm(int32_t expectedTermId,int32_t termId)

{
  IllegalStateException *this;
  char *pcVar1;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (termId == expectedTermId) {
    return;
  }
  this = (IllegalStateException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_98,expectedTermId);
  std::operator+(&local_78,"action possibly delayed: expectedTermId=",&local_98);
  std::operator+(&local_58,&local_78," termId=");
  std::__cxx11::to_string(&local_b8,termId);
  std::operator+(&local_38,&local_58,&local_b8);
  std::__cxx11::string::string
            ((string *)&local_d8,
             "static void aeron::concurrent::logbuffer::TermAppender::checkTerm(std::int32_t, std::int32_t)"
             ,&local_f9);
  pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/TermAppender.h"
                            );
  std::__cxx11::string::string((string *)&local_f8,pcVar1,&local_fa);
  util::IllegalStateException::IllegalStateException(this,&local_38,&local_d8,&local_f8,0x165);
  __cxa_throw(this,&util::IllegalStateException::typeinfo,util::SourcedException::~SourcedException)
  ;
}

Assistant:

inline static void checkTerm(std::int32_t expectedTermId, std::int32_t termId)
    {
        if (termId != expectedTermId)
        {
            throw util::IllegalStateException(
                "action possibly delayed: expectedTermId=" + std::to_string(expectedTermId) +
                " termId=" + std::to_string(termId), SOURCEINFO);
        }
    }